

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_utils.hpp
# Opt level: O2

idx_t __thiscall
duckdb::CountZeros<duckdb::uhugeint_t>::Leading
          (CountZeros<duckdb::uhugeint_t> *this,uhugeint_t value)

{
  idx_t iVar1;
  uint64_t upper;
  uint64_t lower;
  
  if (value.lower != 0) {
    iVar1 = CountZeros<unsigned_long>::Leading(value.lower);
    return iVar1;
  }
  if (this != (CountZeros<duckdb::uhugeint_t> *)0x0) {
    iVar1 = CountZeros<unsigned_long>::Leading((uint64_t)this);
    return iVar1 + 0x40;
  }
  return 0x80;
}

Assistant:

inline static idx_t Leading(uhugeint_t value) {
		const uint64_t upper = static_cast<uint64_t>(value.upper);
		const uint64_t lower = value.lower;

		if (upper) {
			return CountZeros<uint64_t>::Leading(upper);
		} else if (lower) {
			return 64 + CountZeros<uint64_t>::Leading(lower);
		} else {
			return 128;
		}
	}